

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue FColorCVar::FromInt2(int value,ECVarType type)

{
  ECVarType type_local;
  int value_local;
  UCVarValue ret;
  
  if (type == CVAR_String) {
    mysnprintf(cstrbuf,0x28,"%02x %02x %02x",(ulong)(value >> 0x10 & 0xff),
               (ulong)(value >> 8 & 0xff),(ulong)(value & 0xff));
    _type_local = cstrbuf;
  }
  else {
    _type_local = (char *)FBaseCVar::FromInt(value,type);
  }
  return (UCVarValue)_type_local;
}

Assistant:

UCVarValue FColorCVar::FromInt2 (int value, ECVarType type)
{
	if (type == CVAR_String)
	{
		UCVarValue ret;
		mysnprintf (cstrbuf, countof(cstrbuf), "%02x %02x %02x",
			RPART(value), GPART(value), BPART(value));
		ret.String = cstrbuf;
		return ret;
	}
	return FromInt (value, type);
}